

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.cpp
# Opt level: O2

void __thiscall
duckdb::Index::Index
          (Index *this,vector<unsigned_long,_true> *column_ids,TableIOManager *table_io_manager,
          AttachedDatabase *db)

{
  this->_vptr_Index = (_func_int **)&PTR__Index_027b52c0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&(this->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
             &column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  (this->column_id_set)._M_h._M_buckets = &(this->column_id_set)._M_h._M_single_bucket;
  (this->column_id_set)._M_h._M_bucket_count = 1;
  (this->column_id_set)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->column_id_set)._M_h._M_element_count = 0;
  (this->column_id_set)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->column_id_set)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->column_id_set)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->table_io_manager = table_io_manager;
  this->db = db;
  ::std::__detail::
  _Insert_base<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  insert<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((_Insert_base<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&this->column_id_set,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  return;
}

Assistant:

Index::Index(const vector<column_t> &column_ids, TableIOManager &table_io_manager, AttachedDatabase &db)

    : column_ids(column_ids), table_io_manager(table_io_manager), db(db) {

	if (!Radix::IsLittleEndian()) {
		throw NotImplementedException("indexes are not supported on big endian architectures");
	}
	// create the column id set
	column_id_set.insert(column_ids.begin(), column_ids.end());
}